

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

void __thiscall
testing::Action<unsigned_int_()>::Action
          (Action<unsigned_int_()> *this,ActionInterface<unsigned_int_()> *impl)

{
  ActionAdapter local_28;
  ActionInterface<unsigned_int_()> *local_18;
  ActionInterface<unsigned_int_()> *impl_local;
  Action<unsigned_int_()> *this_local;
  
  local_18 = impl;
  impl_local = (ActionInterface<unsigned_int_()> *)this;
  std::shared_ptr<testing::ActionInterface<unsigned_int()>>::
  shared_ptr<testing::ActionInterface<unsigned_int()>,void>
            ((shared_ptr<testing::ActionInterface<unsigned_int()>> *)&local_28,impl);
  std::function<unsigned_int()>::function<testing::Action<unsigned_int()>::ActionAdapter,void>
            ((function<unsigned_int()> *)this,&local_28);
  ActionAdapter::~ActionAdapter(&local_28);
  return;
}

Assistant:

explicit Action(ActionInterface<F>* impl)
      : fun_(ActionAdapter{::std::shared_ptr<ActionInterface<F>>(impl)}) {}